

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
llvm::cl::parser<char>::printOptionDiff
          (parser<char> *this,Option *O,char V,OptionValue<char> *D,size_t GlobalWidth)

{
  bool bVar1;
  byte bVar2;
  byte *__buf;
  raw_ostream *prVar3;
  OptionValue<char> *__n;
  void *__buf_00;
  uint NumSpaces;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  string Str;
  raw_string_ostream SS;
  string local_80;
  raw_string_ostream local_60;
  
  __n = D;
  basic_parser_impl::printOptionName((basic_parser_impl *)this,O,GlobalWidth);
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_60.super_raw_ostream.BufferMode = InternalBuffer;
  local_60.super_raw_ostream.OutBufStart = (char *)0x0;
  local_60.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_60.super_raw_ostream.OutBufCur = (char *)0x0;
  local_60.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_001cd3d0;
  local_60.OS = &local_80;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  raw_ostream::write(&local_60.super_raw_ostream,(uint)(byte)V,__buf_00,(size_t)__n);
  raw_string_ostream::~raw_string_ostream(&local_60);
  prVar3 = outs();
  Str_00.Length = 2;
  Str_00.Data = "= ";
  prVar3 = raw_ostream::operator<<(prVar3,Str_00);
  raw_ostream::write(prVar3,(int)local_80._M_dataplus._M_p,(void *)local_80._M_string_length,
                     (size_t)__n);
  NumSpaces = 8 - (int)local_80._M_string_length;
  if (&DAT_00000007 < local_80._M_string_length) {
    NumSpaces = 0;
  }
  prVar3 = outs();
  prVar3 = raw_ostream::indent(prVar3,NumSpaces);
  Str_01.Length = 0xb;
  Str_01.Data = " (default: ";
  raw_ostream::operator<<(prVar3,Str_01);
  bVar1 = (D->super_OptionValueBase<char,_false>).super_OptionValueCopy<char>.Valid;
  prVar3 = outs();
  if (bVar1 == true) {
    if ((D->super_OptionValueBase<char,_false>).super_OptionValueCopy<char>.Valid == false) {
      __assert_fail("Valid && \"invalid option value\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/CommandLine.h"
                    ,0x1fc,
                    "const DataType &llvm::cl::OptionValueCopy<char>::getValue() const [DataType = char]"
                   );
    }
    bVar2 = (D->super_OptionValueBase<char,_false>).super_OptionValueCopy<char>.Value;
    __buf = (byte *)prVar3->OutBufCur;
    if (__buf < prVar3->OutBufEnd) {
      prVar3->OutBufCur = (char *)(__buf + 1);
      *__buf = bVar2;
    }
    else {
      raw_ostream::write(prVar3,(uint)bVar2,__buf,CONCAT71((int7)((ulong)__n >> 8),bVar2));
    }
  }
  else {
    Str_02.Length = 0xc;
    Str_02.Data = "*no default*";
    raw_ostream::operator<<(prVar3,Str_02);
  }
  prVar3 = outs();
  Str_03.Length = 2;
  Str_03.Data = ")\n";
  raw_ostream::operator<<(prVar3,Str_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void parser<std::string>::printOptionDiff(const Option &O, StringRef V,
                                          const OptionValue<std::string> &D,
                                          size_t GlobalWidth) const {
  printOptionName(O, GlobalWidth);
  outs() << "= " << V;
  size_t NumSpaces = MaxOptWidth > V.size() ? MaxOptWidth - V.size() : 0;
  outs().indent(NumSpaces) << " (default: ";
  if (D.hasValue())
    outs() << D.getValue();
  else
    outs() << "*no default*";
  outs() << ")\n";
}